

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_NestedEnumFeatures_Test::
FeaturesTest_NestedEnumFeatures_Test(FeaturesTest_NestedEnumFeatures_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_FeaturesTest).super_FeaturesBaseTest.super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_01884b50;
  DescriptorPool::DescriptorPool(&(this->super_FeaturesTest).super_FeaturesBaseTest.pool_);
  (this->super_FeaturesTest).super_FeaturesBaseTest.super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_0187e788;
  return;
}

Assistant:

TEST_F(FeaturesTest, NestedEnumFeatures) {
  BuildDescriptorMessagesInTestPool();
  BuildFileInTestPool(pb::TestFeatures::descriptor()->file());
  const FileDescriptor* file = BuildFile(R"pb(
    name: "foo.proto"
    syntax: "editions"
    edition: EDITION_2023
    dependency: "google/protobuf/unittest_features.proto"
    options {
      features {
        [pb.test] { multiple_feature: VALUE2 file_feature: VALUE7 }
      }
    }
    message_type {
      name: "Foo"
      options {
        features {
          [pb.test] { multiple_feature: VALUE10 message_feature: VALUE3 }
        }
      }
      enum_type {
        name: "Bar"
        options {
          features {
            [pb.test] { multiple_feature: VALUE5 }
          }
        }
        value { name: "BAR" number: 0 }
      }
    }
  )pb");
  const EnumDescriptor* enm = file->message_type(0)->enum_type(0);
  EXPECT_THAT(enm->options(), EqualsProto(""));
  EXPECT_EQ(GetFeatures(enm).GetExtension(pb::test).field_feature(),
            pb::VALUE1);
  EXPECT_EQ(GetFeatures(enm).GetExtension(pb::test).multiple_feature(),
            pb::VALUE5);
  EXPECT_EQ(GetFeatures(enm).GetExtension(pb::test).file_feature(), pb::VALUE7);
  EXPECT_EQ(GetFeatures(enm).GetExtension(pb::test).message_feature(),
            pb::VALUE3);
}